

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O3

boolean is_racial_armor(obj *otmp,monst *mtmp)

{
  uint uVar1;
  
  if (mtmp == &youmonst) {
    if (urace.malenum != 0x111) {
      if (urace.malenum == 0x4a) goto LAB_001b422c;
      if (urace.malenum != 0x2d) {
        return '\0';
      }
      goto LAB_001b41ee;
    }
  }
  else {
    if (mtmp == (monst *)0x0) {
      return '\0';
    }
    uVar1 = mtmp->data->mflags2;
    if ((uVar1 & 0x20) != 0) {
LAB_001b41ee:
      uVar1 = (ushort)otmp->otyp - 0x6f;
      if ((uVar1 < 0x1f) && ((0x40010001U >> (uVar1 & 0x1f) & 1) != 0)) {
        return '\x01';
      }
      if (otmp->otyp != 0x4a) {
        return '\0';
      }
      return '\x01';
    }
    if ((uVar1 & 0x10) == 0) {
      if ((uVar1 & 0xc0) != 0x80) {
        return '\0';
      }
LAB_001b422c:
      uVar1 = (ushort)otmp->otyp - 0x72;
      if ((uVar1 < 0x1a) && ((0x3001011U >> (uVar1 & 0x1f) & 1) != 0)) {
        return '\x01';
      }
      if (otmp->otyp != 0x49) {
        return '\0';
      }
      return '\x01';
    }
  }
  uVar1 = (ushort)otmp->otyp - 0x70;
  if (((0x29 < uVar1) || ((0x20002002001U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
     (otmp->otyp != 0x48)) {
    return '\0';
  }
  return '\x01';
}

Assistant:

boolean is_racial_armor(const struct obj *otmp, const struct monst *mtmp)
{
	if (mtmp == &youmonst) {
	    if (Race_if(PM_DWARF)) return is_dwarvish_armor(otmp);
	    else if (Race_if(PM_ELF)) return is_elven_armor(otmp);
	    else if (Race_if(PM_GNOME)) return is_gnomish_armor(otmp);
	    else if (Race_if(PM_ORC)) return is_orcish_armor(otmp);
	} else if (mtmp) {
	    const struct permonst *mdat = mtmp->data;
	    if (is_dwarf(mdat)) return is_dwarvish_armor(otmp);
	    else if (is_elf(mdat)) return is_elven_armor(otmp);
	    else if (is_gnome(mdat)) return is_gnomish_armor(otmp);
	    else if (is_orc(mdat)) return is_orcish_armor(otmp);
	}
	return FALSE;
}